

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
AppParametersTest_arg_before_env_Test::~AppParametersTest_arg_before_env_Test
          (AppParametersTest_arg_before_env_Test *this)

{
  AppParametersTest_arg_before_env_Test *this_local;
  
  ~AppParametersTest_arg_before_env_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AppParametersTest, arg_before_env) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe", L"--switch", L"-key", L"value" };
	ArgWrapper<wchar_t> envs{ L"key=other_value", L"other_key=some_value" };
	app_parameters parameters{ args.argc(), args.argv(), envs.argv() };

	EXPECT_EQ(parameters.get_arg_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_env_value(u8"key"), u8"other_value");
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_value(u8"other_key"), u8"some_value");
}